

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O0

void usage(FILE *stream)

{
  FILE *stream_local;
  
  fprintf((FILE *)stream,
          "USAGE: %s -c <output-file> [-3] [-a <uuid>] [-b <buffer-size>]\n       [-d <duration>] [-e|-E] [-f <start-frame>] [-j <key-id-string>]\n       [-k <key-string>] [-l <label>] [-L] [-M] [-p <frame-rate>] [-R]\n       [-s <num>] [-v] [-W] [-z|-Z] <input-file> [<input-file-2> ...]\n\n       %s [-h|-help] [-V]\n\n       %s -i [-H] [-n] [-v] <input-file>\n\n       %s -g | -u\n\n       %s -G [-v] <input-file>\n\n       %s -t <input-file>\n\n       %s -x <file-prefix> [-3] [-b <buffer-size>] [-d <duration>]\n       [-f <starting-frame>] [-m] [-p <frame-rate>] [-R] [-s <num>] [-S|-1]\n       [-v] [-W] [-w] <input-file>\n\n"
          ,PROGRAM_NAME,PROGRAM_NAME,PROGRAM_NAME,PROGRAM_NAME,PROGRAM_NAME,PROGRAM_NAME,
          PROGRAM_NAME);
  fprintf((FILE *)stream,
          "Major modes:\n  -3                - With -c, create a stereoscopic image file. Expects two\n                      directories of JP2K codestreams (directories must have\n                      an equal number of frames; left eye is first).\n                    - With -x, force stereoscopic interpretation of a JP2K\n                      track file.\n  -c <output-file>  - Create an AS-DCP track file from input(s)\n  -g                - Generate a random 16 byte value to stdout\n  -G                - Perform GOP start lookup test on MXF+Interop MPEG file\n  -h | -help        - Show help\n  -i                - Show file info\n  -t                - Calculate message digest of input file\n  -U                - Dump UL catalog to stdout\n  -u                - Generate a random UUID value to stdout\n  -V                - Show version information\n  -x <root-name>    - Extract essence from AS-DCP file to named file(s)\n\n"
         );
  fprintf((FILE *)stream,
          "Security Options:\n  -e                - Encrypt MPEG or JP2K headers (default)\n  -E                - Do not encrypt MPEG or JP2K headers\n  -j <key-id-str>   - Write key ID instead of creating a random value\n  -k <key-string>   - Use key for ciphertext operations\n  -m                - verify HMAC values when reading\n  -M                - Do not create HMAC values when writing\n\n"
         );
  fprintf((FILE *)stream,
          "Read/Write Options:\n  -a <UUID>         - Specify the Asset ID of a file (with -c)\n  -b <buffer-size>  - Specify size in bytes of picture frame buffer.\n                      Defaults to 4,194,304 (4MB)\n  -d <duration>     - Number of frames to process, default all\n  -f <start-frame>  - Starting frame number, default 0\n  -l <label>        - Use given channel format label when writing MXF sound\n                      files. SMPTE 429-2 labels: \'5.1\', \'6.1\', \'7.1\', \'7.1DS\', \'WTF\'.\n                      Default is no label (valid for Interop only).\n  -L                - Write SMPTE UL values instead of MXF Interop\n  -p <rate>         - fps of picture when wrapping PCM or JP2K:\n                      Use one of [23|24|25|30|48|50|60], 24 is default\n  -R                - Repeat the first frame over the entire file (picture\n                      essence only, requires -c, -d)\n  -S                - Split Wave essence to stereo WAV files during extract.\n                      Default is multichannel WAV\n  -1                - Split Wave essence to mono WAV files during extract.\n                      Default is multichannel WAV\n  -W                - Read input file only, do not write source file\n  -w <width>        - Width of numeric element in a series of frame file names\n                      (use with -x, default 6).\n  -z                - Fail if j2c inputs have unequal parameters (default)\n  -Z                - Ignore unequal parameters in j2c inputs\n\n"
         );
  fprintf((FILE *)stream,
          "Info Options:\n  -H                - Show MXF header metadata, used with option -i\n  -n                - Show index, used with option -i\n\nOther Options:\n  -s <num>          - Number of bytes of frame buffer to be dumped as hex to\n                      stderr, used with option -v\n  -v                - Verbose, prints informative messages to stderr\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n         o An argument of \"23\" to the -p option will be interpreted\n           as 24000/1001 fps.\n\n"
         );
  return;
}

Assistant:

void
usage(FILE* stream = stdout)
{
  fprintf(stream, "\
USAGE: %s -c <output-file> [-3] [-a <uuid>] [-b <buffer-size>]\n\
       [-d <duration>] [-e|-E] [-f <start-frame>] [-j <key-id-string>]\n\
       [-k <key-string>] [-l <label>] [-L] [-M] [-p <frame-rate>] [-R]\n\
       [-s <num>] [-v] [-W] [-z|-Z] <input-file> [<input-file-2> ...]\n\
\n\
       %s [-h|-help] [-V]\n\
\n\
       %s -i [-H] [-n] [-v] <input-file>\n\
\n\
       %s -g | -u\n\
\n\
       %s -G [-v] <input-file>\n\
\n\
       %s -t <input-file>\n\
\n\
       %s -x <file-prefix> [-3] [-b <buffer-size>] [-d <duration>]\n\
       [-f <starting-frame>] [-m] [-p <frame-rate>] [-R] [-s <num>] [-S|-1]\n\
       [-v] [-W] [-w] <input-file>\n\n",
	  PROGRAM_NAME, PROGRAM_NAME, PROGRAM_NAME, PROGRAM_NAME,
	  PROGRAM_NAME, PROGRAM_NAME, PROGRAM_NAME);

  fprintf(stream, "\
Major modes:\n\
  -3                - With -c, create a stereoscopic image file. Expects two\n\
                      directories of JP2K codestreams (directories must have\n\
                      an equal number of frames; left eye is first).\n\
                    - With -x, force stereoscopic interpretation of a JP2K\n\
                      track file.\n\
  -c <output-file>  - Create an AS-DCP track file from input(s)\n\
  -g                - Generate a random 16 byte value to stdout\n\
  -G                - Perform GOP start lookup test on MXF+Interop MPEG file\n\
  -h | -help        - Show help\n\
  -i                - Show file info\n\
  -t                - Calculate message digest of input file\n\
  -U                - Dump UL catalog to stdout\n\
  -u                - Generate a random UUID value to stdout\n\
  -V                - Show version information\n\
  -x <root-name>    - Extract essence from AS-DCP file to named file(s)\n\
\n");

  fprintf(stream, "\
Security Options:\n\
  -e                - Encrypt MPEG or JP2K headers (default)\n\
  -E                - Do not encrypt MPEG or JP2K headers\n\
  -j <key-id-str>   - Write key ID instead of creating a random value\n\
  -k <key-string>   - Use key for ciphertext operations\n\
  -m                - verify HMAC values when reading\n\
  -M                - Do not create HMAC values when writing\n\
\n");

  fprintf(stream, "\
Read/Write Options:\n\
  -a <UUID>         - Specify the Asset ID of a file (with -c)\n\
  -b <buffer-size>  - Specify size in bytes of picture frame buffer.\n\
                      Defaults to 4,194,304 (4MB)\n\
  -d <duration>     - Number of frames to process, default all\n\
  -f <start-frame>  - Starting frame number, default 0\n\
  -l <label>        - Use given channel format label when writing MXF sound\n\
                      files. SMPTE 429-2 labels: '5.1', '6.1', '7.1', '7.1DS', 'WTF'.\n\
                      Default is no label (valid for Interop only).\n\
  -L                - Write SMPTE UL values instead of MXF Interop\n\
  -p <rate>         - fps of picture when wrapping PCM or JP2K:\n\
                      Use one of [23|24|25|30|48|50|60], 24 is default\n\
  -R                - Repeat the first frame over the entire file (picture\n\
                      essence only, requires -c, -d)\n\
  -S                - Split Wave essence to stereo WAV files during extract.\n\
                      Default is multichannel WAV\n\
  -1                - Split Wave essence to mono WAV files during extract.\n\
                      Default is multichannel WAV\n\
  -W                - Read input file only, do not write source file\n\
  -w <width>        - Width of numeric element in a series of frame file names\n\
                      (use with -x, default 6).\n\
  -z                - Fail if j2c inputs have unequal parameters (default)\n\
  -Z                - Ignore unequal parameters in j2c inputs\n\
\n");

  fprintf(stream, "\
Info Options:\n\
  -H                - Show MXF header metadata, used with option -i\n\
  -n                - Show index, used with option -i\n\
\n\
Other Options:\n\
  -s <num>          - Number of bytes of frame buffer to be dumped as hex to\n\
                      stderr, used with option -v\n\
  -v                - Verbose, prints informative messages to stderr\n\
\n\
  NOTES: o There is no option grouping, all options must be distinct arguments.\n\
         o All option arguments must be separated from the option by whitespace.\n\
         o An argument of \"23\" to the -p option will be interpreted\n\
           as 24000/1001 fps.\n\
\n");
}